

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureStateQueryTests::init
          (TextureStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  undefined8 *puVar2;
  TestContext *pTVar3;
  RenderContext *pRVar4;
  bool bVar5;
  undefined8 in_RAX;
  TestNode *pTVar6;
  TestNode *pTVar7;
  char *pcVar8;
  long lVar9;
  undefined8 extraout_RAX;
  undefined4 uVar10;
  long lVar11;
  GLenum target;
  QueryType QVar12;
  allocator<char> local_ea;
  char local_e9;
  undefined8 *local_e8;
  long local_e0;
  TestNode *local_d8;
  TestNode *local_d0;
  TestNode *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  long local_60;
  long local_58;
  string local_50;
  
  lVar11 = 0;
  local_d0 = (TestNode *)this;
  while (pTVar7 = local_d0, lVar11 != 8) {
    pTVar6 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,init::textureTargets[lVar11].name,
               init::textureTargets[lVar11].name);
    local_d8 = pTVar6;
    tcu::TestNode::addChild(pTVar7,pTVar6);
    local_e9 = init::textureTargets[lVar11].newInGLES31;
    if ((bool)local_e9 == false) {
      local_e0 = CONCAT44(local_e0._4_4_,init::textureTargets[lVar11].target);
    }
    else {
      pTVar3 = pTVar7->m_testCtx;
      pRVar4 = (RenderContext *)pTVar7[1]._vptr_TestNode[1];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"is_texture",(allocator<char> *)&local_c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"IsTexture",(allocator<char> *)&local_50);
      local_e0 = CONCAT44(local_e0._4_4_,init::textureTargets[lVar11].target);
      pTVar7 = &deqp::gls::TextureStateQueryTests::createIsTextureTest
                          (pTVar3,pRVar4,&local_80,&local_a0,init::textureTargets[lVar11].target)->
                super_TestNode;
      tcu::TestNode::addChild(local_d8,pTVar7);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar9 = 0;
    local_58 = lVar11;
    while (lVar9 != 0x17) {
      local_e8 = (undefined8 *)(lVar9 * 0x18);
      local_c8 = (TestNode *)(ulong)*(TesterType *)(local_e8 + 0x3ca2be);
      local_60 = lVar9;
      bVar5 = deqp::gls::TextureStateQueryTests::isLegalTesterForTarget
                        ((GLenum)local_e0,*(TesterType *)(local_e8 + 0x3ca2be));
      if ((bVar5) &&
         ((puVar2 = local_e8 + 0x3ca2bc, local_e9 != '\0' ||
          (pcVar1 = (char *)((long)local_e8 + 0x1e515f4), local_e8 = puVar2, *pcVar1 == '\x01')))) {
        if ((int)local_c8 - 0x36U < 3) {
          pcVar1 = (char *)*puVar2;
          local_e8 = puVar2;
          for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 4) {
            QVar12 = *(QueryType *)((long)init()::nonPureVerifiers + lVar11);
            pTVar3 = local_d0->m_testCtx;
            pRVar4 = (RenderContext *)local_d0[1]._vptr_TestNode[1];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            local_c0._M_string_length = 0;
            local_c0.field_2._M_local_buf[0] = '\0';
            std::operator+(&local_a0,&local_c0,pcVar1);
            pcVar8 = getVerifierSuffix(QVar12);
            std::operator+(&local_80,&local_a0,pcVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,(char *)local_e8[1],&local_ea);
            pTVar7 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar3,pRVar4,&local_80,&local_50,QVar12,(GLenum)local_e0,
                                 (TesterType)local_c8)->super_TestNode;
            tcu::TestNode::addChild(local_d8,pTVar7);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        else if ((int)local_c8 == 0x35) {
          pcVar1 = (char *)*puVar2;
          local_e8 = puVar2;
          for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
            QVar12 = *(QueryType *)((long)init::vec4Verifiers + lVar11);
            pTVar3 = local_d0->m_testCtx;
            pRVar4 = (RenderContext *)local_d0[1]._vptr_TestNode[1];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            local_c0._M_string_length = 0;
            local_c0.field_2._M_local_buf[0] = '\0';
            std::operator+(&local_a0,&local_c0,pcVar1);
            pcVar8 = getVerifierSuffix(QVar12);
            std::operator+(&local_80,&local_a0,pcVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,(char *)local_e8[1],&local_ea);
            pTVar7 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar3,pRVar4,&local_80,&local_50,QVar12,(GLenum)local_e0,
                                 TESTER_TEXTURE_BORDER_COLOR)->super_TestNode;
            tcu::TestNode::addChild(local_d8,pTVar7);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
        else {
          pcVar1 = (char *)*puVar2;
          local_e8 = puVar2;
          for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 4) {
            QVar12 = *(QueryType *)((long)init::scalarVerifiers + lVar11);
            pTVar3 = local_d0->m_testCtx;
            pRVar4 = (RenderContext *)local_d0[1]._vptr_TestNode[1];
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            local_c0._M_string_length = 0;
            local_c0.field_2._M_local_buf[0] = '\0';
            std::operator+(&local_a0,&local_c0,pcVar1);
            pcVar8 = getVerifierSuffix(QVar12);
            std::operator+(&local_80,&local_a0,pcVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,(char *)local_e8[1],&local_ea);
            pTVar7 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                                (pTVar3,pRVar4,&local_80,&local_50,QVar12,(GLenum)local_e0,
                                 (TesterType)local_c8)->super_TestNode;
            tcu::TestNode::addChild(local_d8,pTVar7);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
          }
        }
      }
      lVar9 = local_60 + 1;
    }
    in_RAX = 0x17;
    lVar11 = local_58 + 1;
  }
  lVar11 = 0;
  while (pTVar7 = local_d0, lVar11 != 2) {
    pTVar6 = (TestNode *)operator_new(0x70);
    local_60 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar6,pTVar7->m_testCtx,init::pureSetters[lVar11].name,
               init::pureSetters[lVar11].desc);
    local_c8 = pTVar6;
    tcu::TestNode::addChild(pTVar7,pTVar6);
    QVar12 = init::pureSetters[lVar11].verifier;
    local_d8 = (TestNode *)CONCAT44(local_d8._4_4_,QVar12);
    lVar11 = 0x14;
    in_RAX = extraout_RAX;
    while (lVar11 != 0x1ac) {
      if (QVar12 == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER) {
        uVar10 = *(undefined4 *)((long)&init::pureStates[0].name + lVar11);
      }
      else {
        uVar10 = 0x39;
        if (QVar12 == QUERY_TEXTURE_PARAM_PURE_INTEGER) {
          uVar10 = *(undefined4 *)(&init::pureSetters[1].field_0x14 + lVar11);
        }
      }
      local_e8 = (undefined8 *)CONCAT44(local_e8._4_4_,uVar10);
      target = 0xde1;
      if (*(int *)(&init::pureSetters[1].field_0x14 + lVar11) == 0x13) {
        target = 0x806f;
      }
      pTVar3 = local_d0->m_testCtx;
      pRVar4 = (RenderContext *)local_d0[1]._vptr_TestNode[1];
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      std::operator+(&local_80,&local_a0,*(char **)((long)&init::pureSetters[1].name + lVar11 + 4));
      local_e0 = lVar11;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,*(char **)((long)&init::pureSetters[1].desc + lVar11 + 4),
                 (allocator<char> *)&local_50);
      QVar12 = (QueryType)local_d8;
      pTVar7 = &deqp::gls::TextureStateQueryTests::createTexParamTest
                          (pTVar3,pRVar4,&local_80,&local_c0,(QueryType)local_d8,target,
                           (TesterType)local_e8)->super_TestNode;
      tcu::TestNode::addChild(local_c8,pTVar7);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_80);
      in_RAX = std::__cxx11::string::~string((string *)&local_a0);
      lVar11 = local_e0 + 0x18;
    }
    lVar11 = local_60 + 1;
  }
  return (int)in_RAX;
}

Assistant:

void TextureStateQueryTests::init (void)
{
	static const QueryType scalarVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
		QUERY_TEXTURE_PARAM_PURE_INTEGER,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER,
	};
	static const QueryType nonPureVerifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER,
		QUERY_TEXTURE_PARAM_FLOAT,
	};
	static const QueryType vec4Verifiers[] =
	{
		QUERY_TEXTURE_PARAM_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_FLOAT_VEC4,
		QUERY_TEXTURE_PARAM_PURE_INTEGER_VEC4,
		QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER_VEC4,
	};

#define FOR_EACH_VERIFIER(VERIFIERS, X) \
	for (int verifierNdx = 0; verifierNdx < DE_LENGTH_OF_ARRAY(VERIFIERS); ++verifierNdx)	\
	{																						\
		const char* verifierSuffix = getVerifierSuffix((VERIFIERS)[verifierNdx]);			\
		const QueryType verifier = (VERIFIERS)[verifierNdx];								\
		targetGroup->addChild(X);															\
	}

	static const struct
	{
		const char*	name;
		glw::GLenum	target;
		bool		newInGLES31;
	} textureTargets[] =
	{
		{ "texture_2d",						GL_TEXTURE_2D,						false,	},
		{ "texture_3d",						GL_TEXTURE_3D,						false,	},
		{ "texture_2d_array",				GL_TEXTURE_2D_ARRAY,				false,	},
		{ "texture_cube_map",				GL_TEXTURE_CUBE_MAP,				false,	},
		{ "texture_2d_multisample",			GL_TEXTURE_2D_MULTISAMPLE,			true,	},
		{ "texture_2d_multisample_array",	GL_TEXTURE_2D_MULTISAMPLE_ARRAY,	true,	}, // GL_OES_texture_storage_multisample_2d_array
		{ "texture_buffer",					GL_TEXTURE_BUFFER,					true,	}, // GL_EXT_texture_buffer
		{ "texture_cube_array",				GL_TEXTURE_CUBE_MAP_ARRAY,			true,	}, // GL_EXT_texture_cube_map_array
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	tester;
		bool		newInGLES31;
	} states[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R,				false	},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G,				false	},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B,				false	},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A,				false	},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S,					false	},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T,					false	},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R,					false	},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER,				false	},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER,				false	},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD,					false	},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD,					false	},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL,				false	},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL,				false	},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE,			false	},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC,			false	},
		{ "texture_immutable_levels",		"TEXTURE_IMMUTABLE_LEVELS",			TESTER_TEXTURE_IMMUTABLE_LEVELS,		false	},
		{ "texture_immutable_format",		"TEXTURE_IMMUTABLE_FORMAT",			TESTER_TEXTURE_IMMUTABLE_FORMAT,		false	},
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE,		true	},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT,			true	},
		{ "texture_border_color",			"TEXTURE_BORDER_COLOR",				TESTER_TEXTURE_BORDER_COLOR,			true	},
		{ "texture_wrap_s_clamp_to_border",	"TEXTURE_WRAP_S_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_S_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_t_clamp_to_border",	"TEXTURE_WRAP_T_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_T_CLAMP_TO_BORDER,	true	},
		{ "texture_wrap_r_clamp_to_border",	"TEXTURE_WRAP_R_CLAMP_TO_BORDER",	TESTER_TEXTURE_WRAP_R_CLAMP_TO_BORDER,	true	},
	};
	static const struct
	{
		const char* name;
		const char* desc;
		QueryType	verifier;
	} pureSetters[] =
	{
		{ "set_pure_int",	"Set state with pure int",			QUERY_TEXTURE_PARAM_PURE_INTEGER			},
		{ "set_pure_uint",	"Set state with pure unsigned int",	QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER	},
	};
	static const struct
	{
		const char*	name;
		const char*	desc;
		TesterType	intTester;
		TesterType	uintTester;
	} pureStates[] =
	{
		{ "texture_swizzle_r",				"TEXTURE_SWIZZLE_R",				TESTER_TEXTURE_SWIZZLE_R_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_R_SET_PURE_UINT				},
		{ "texture_swizzle_g",				"TEXTURE_SWIZZLE_G",				TESTER_TEXTURE_SWIZZLE_G_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_G_SET_PURE_UINT				},
		{ "texture_swizzle_b",				"TEXTURE_SWIZZLE_B",				TESTER_TEXTURE_SWIZZLE_B_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_B_SET_PURE_UINT				},
		{ "texture_swizzle_a",				"TEXTURE_SWIZZLE_A",				TESTER_TEXTURE_SWIZZLE_A_SET_PURE_INT,			TESTER_TEXTURE_SWIZZLE_A_SET_PURE_UINT				},
		{ "texture_wrap_s",					"TEXTURE_WRAP_S",					TESTER_TEXTURE_WRAP_S_SET_PURE_INT,				TESTER_TEXTURE_WRAP_S_SET_PURE_UINT					},
		{ "texture_wrap_t",					"TEXTURE_WRAP_T",					TESTER_TEXTURE_WRAP_T_SET_PURE_INT,				TESTER_TEXTURE_WRAP_T_SET_PURE_UINT					},
		{ "texture_wrap_r",					"TEXTURE_WRAP_R",					TESTER_TEXTURE_WRAP_R_SET_PURE_INT,				TESTER_TEXTURE_WRAP_R_SET_PURE_UINT					},
		{ "texture_mag_filter",				"TEXTURE_MAG_FILTER",				TESTER_TEXTURE_MAG_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MAG_FILTER_SET_PURE_UINT				},
		{ "texture_min_filter",				"TEXTURE_MIN_FILTER",				TESTER_TEXTURE_MIN_FILTER_SET_PURE_INT,			TESTER_TEXTURE_MIN_FILTER_SET_PURE_UINT				},
		{ "texture_min_lod",				"TEXTURE_MIN_LOD",					TESTER_TEXTURE_MIN_LOD_SET_PURE_INT,			TESTER_TEXTURE_MIN_LOD_SET_PURE_UINT				},
		{ "texture_max_lod",				"TEXTURE_MAX_LOD",					TESTER_TEXTURE_MAX_LOD_SET_PURE_INT,			TESTER_TEXTURE_MAX_LOD_SET_PURE_UINT				},
		{ "texture_base_level",				"TEXTURE_BASE_LEVEL",				TESTER_TEXTURE_BASE_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_BASE_LEVEL_SET_PURE_UINT				},
		{ "texture_max_level",				"TEXTURE_MAX_LEVEL",				TESTER_TEXTURE_MAX_LEVEL_SET_PURE_INT,			TESTER_TEXTURE_MAX_LEVEL_SET_PURE_UINT				},
		{ "texture_compare_mode",			"TEXTURE_COMPARE_MODE",				TESTER_TEXTURE_COMPARE_MODE_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_MODE_SET_PURE_UINT			},
		{ "texture_compare_func",			"TEXTURE_COMPARE_FUNC",				TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_INT,		TESTER_TEXTURE_COMPARE_FUNC_SET_PURE_UINT			},
		// \note texture_immutable_levels is not settable
		// \note texture_immutable_format is not settable
		{ "depth_stencil_mode",				"DEPTH_STENCIL_TEXTURE_MODE",		TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_INT,	TESTER_DEPTH_STENCIL_TEXTURE_MODE_SET_PURE_UINT		},
		{ "texture_srgb_decode",			"TEXTURE_SRGB_DECODE_EXT",			TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_INT,	TESTER_TEXTURE_SRGB_DECODE_EXT_SET_PURE_UINT		},
		// \note texture_border_color is already checked
		// \note texture_wrap_*_clamp_to_border brings no additional coverage
	};

	for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(textureTargets); ++targetNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, textureTargets[targetNdx].name, textureTargets[targetNdx].name);
		addChild(targetGroup);

		if (textureTargets[targetNdx].newInGLES31)
		{
			targetGroup->addChild(createIsTextureTest(m_testCtx,
													  m_context.getRenderContext(),
													  "is_texture",
													  "IsTexture",
													  textureTargets[targetNdx].target));
		}

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(states); ++stateNdx)
		{
			if (!isLegalTesterForTarget(textureTargets[targetNdx].target, states[stateNdx].tester))
				continue;

			// for old targets, check only new states
			if (!textureTargets[targetNdx].newInGLES31 && !states[stateNdx].newInGLES31)
				continue;

			if (isExtendedParamQuery(states[stateNdx].tester))
			{
				// no need to cover for all getters if the only thing new is the param name
				FOR_EACH_VERIFIER(nonPureVerifiers, createTexParamTest(m_testCtx,
																	   m_context.getRenderContext(),
																	   std::string() + states[stateNdx].name + verifierSuffix,
																	   states[stateNdx].desc,
																	   verifier,
																	   textureTargets[targetNdx].target,
																	   states[stateNdx].tester));
			}
			else if (isIsVectorQuery(states[stateNdx].tester))
			{
				FOR_EACH_VERIFIER(vec4Verifiers, createTexParamTest(m_testCtx,
																	m_context.getRenderContext(),
																	std::string() + states[stateNdx].name + verifierSuffix,
																	states[stateNdx].desc,
																	verifier,
																	textureTargets[targetNdx].target,
																	states[stateNdx].tester));
			}
			else
			{
				FOR_EACH_VERIFIER(scalarVerifiers, createTexParamTest(m_testCtx,
																	  m_context.getRenderContext(),
																	  std::string() + states[stateNdx].name + verifierSuffix,
																	  states[stateNdx].desc,
																	  verifier,
																	  textureTargets[targetNdx].target,
																	  states[stateNdx].tester));
			}
		}
	}

#undef FOR_EACH_VERIFIER

	// set_pure_uint
	// set_pure_int
	for (int setterNdx = 0; setterNdx < DE_LENGTH_OF_ARRAY(pureSetters); ++setterNdx)
	{
		tcu::TestCaseGroup* const targetGroup = new tcu::TestCaseGroup(m_testCtx, pureSetters[setterNdx].name, pureSetters[setterNdx].desc);
		addChild(targetGroup);

		for (int stateNdx = 0; stateNdx < DE_LENGTH_OF_ARRAY(pureStates); ++stateNdx)
		{
			const TesterType	tester	= (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_INTEGER)				? (pureStates[stateNdx].intTester)
										: (pureSetters[setterNdx].verifier == QUERY_TEXTURE_PARAM_PURE_UNSIGNED_INTEGER)	? (pureStates[stateNdx].uintTester)
										: (TESTER_LAST);
			// need 3d texture to test R wrap
			const glw::GLenum	target	= (pureStates[stateNdx].intTester == TESTER_TEXTURE_WRAP_R_SET_PURE_INT) ? (GL_TEXTURE_3D) : (GL_TEXTURE_2D);

			targetGroup->addChild(createTexParamTest(m_testCtx,
													 m_context.getRenderContext(),
													 std::string() + pureStates[stateNdx].name,
													 pureStates[stateNdx].desc,
													 pureSetters[setterNdx].verifier,
													 target,
													 tester));
		}
	}
}